

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  int (*paiVar5) [2];
  long *plVar6;
  undefined8 *puVar7;
  int (*extraout_RAX) [2];
  int (*extraout_RAX_00) [2];
  undefined8 extraout_RAX_01;
  long *plVar8;
  stringstream *psVar9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  int aiVar11 [2];
  long lVar12;
  int extraout_RDX [2];
  int extraout_RDX_00 [2];
  char *pcVar13;
  ostream *poVar14;
  ulong uVar15;
  undefined8 uVar16;
  int aiVar17 [2];
  int aiVar18 [2];
  int aiVar19 [2];
  int aiVar20 [2];
  int local_13c;
  string local_138;
  int local_118;
  int local_114;
  int pipe_fd [2];
  long local_100;
  int aiStack_f8 [2];
  string local_f0;
  int local_d0 [2];
  int local_c8 [2];
  ulong local_c0;
  int aiStack_b8 [2];
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  int local_68 [2];
  ulong local_60;
  int aiStack_58 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  int local_48 [2];
  undefined1 local_40 [16];
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                       ,0x464);
    Message::Message((Message *)&local_50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,
               " in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10," ",1);
    poVar14 = (ostream *)&(local_50._M_head_impl)->field_0x10;
    if (sVar3 == 0) {
      lVar12 = 0x26;
      pcVar13 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)&(local_50._M_head_impl)->field_0x10);
      poVar14 = (ostream *)&(local_50._M_head_impl)->field_0x10;
      lVar12 = 9;
      pcVar13 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar13,lVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,
               " See https://github.com/google/googletest/blob/master/docs/advanced.md#death-tests-and-threads"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_50._M_head_impl)->field_0x10,
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_b0,local_50._M_head_impl);
    if (local_50._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  iVar1 = pipe(&local_118);
  if (iVar1 == -1) {
    aiVar19 = (int  [2])&local_100;
    pipe_fd = aiVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
    aiVar20 = (int  [2])&local_c0;
    local_d0 = *paiVar5;
    aiVar17 = (int  [2])(paiVar5 + 2);
    if (local_d0 == aiVar17) {
      local_c0 = *(ulong *)aiVar17;
      aiStack_b8 = paiVar5[3];
      local_d0 = aiVar20;
    }
    else {
      local_c0 = *(ulong *)aiVar17;
    }
    local_c8 = paiVar5[1];
    *paiVar5 = aiVar17;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)local_d0);
    aiVar17 = (int  [2])&local_60;
    local_70._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
    aiVar18 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_70._M_head_impl == aiVar18) {
      local_60 = *(ulong *)aiVar18;
      aiStack_58 = paiVar5[3];
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)aiVar17;
    }
    else {
      local_60 = *(ulong *)aiVar18;
    }
    local_68 = paiVar5[1];
    *paiVar5 = aiVar18;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    local_138._M_dataplus._M_p._0_4_ = 0x468;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar15 = 0xf;
    if ((int  [2])local_70._M_head_impl != aiVar17) {
      uVar15 = local_60;
    }
    if (uVar15 < local_f0._M_string_length + (long)local_68) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar16 = local_f0.field_2._M_allocated_capacity;
      }
      _Var10._M_head_impl = local_70._M_head_impl;
      if (local_f0._M_string_length + (long)local_68 <= (ulong)uVar16) goto LAB_0015034c;
    }
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
LAB_0015035c:
    local_90 = (long *)*puVar7;
    plVar6 = puVar7 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = puVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_90);
    aiVar18 = (int  [2])local_40;
    local_50._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
    aiVar11 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_50._M_head_impl == aiVar11) {
      local_40._0_8_ = *(undefined8 *)aiVar11;
      local_40._8_8_ = paiVar5[3];
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)aiVar18;
    }
    else {
      local_40._0_8_ = *(undefined8 *)aiVar11;
    }
    local_48 = paiVar5[1];
    *paiVar5 = aiVar11;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_50);
    local_b0._M_dataplus._M_p = *(pointer *)paiVar5;
    aiVar11 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_b0._M_dataplus._M_p == aiVar11) {
      local_b0.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
      local_b0.field_2._8_8_ = paiVar5[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
    }
    local_b0._M_string_length = *(size_type *)(paiVar5 + 1);
    *paiVar5 = aiVar11;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    DeathTestAbort(&local_b0);
    paiVar5 = extraout_RAX_00;
    local_b0._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    aiVar19 = (int  [2])&local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)aiVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((int  [2])local_b0._M_dataplus._M_p != aiVar19) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        do {
          iVar1 = close(local_118);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_114;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_f0);
        pipe_fd = *paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if (pipe_fd == aiVar20) {
          local_100 = *(long *)aiVar20;
          aiStack_f8 = paiVar5[3];
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100 = *(long *)aiVar20;
        }
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)paiVar5[2] = 0;
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
        local_d0 = *paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if (local_d0 == aiVar20) {
          local_c0 = *(ulong *)aiVar20;
          aiStack_b8 = paiVar5[3];
          local_d0 = (int  [2])&local_c0;
        }
        else {
          local_c0 = *(ulong *)aiVar20;
        }
        local_c8 = paiVar5[1];
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)paiVar5[2] = 0;
        local_13c = 0x479;
        StreamableToString<int>(&local_138,&local_13c);
        uVar15 = 0xf;
        if (local_d0 != (int  [2])&local_c0) {
          uVar15 = local_c0;
        }
        if (uVar15 < local_138._M_string_length + (long)local_c8) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar16 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_138._M_string_length + (long)local_c8) goto LAB_0014fe57;
          paiVar5 = (int (*) [2])
                    std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0014fe57:
          paiVar5 = (int (*) [2])
                    std::__cxx11::string::_M_append
                              ((char *)local_d0,
                               (ulong)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                               local_138._M_dataplus._M_p._0_4_));
        }
        local_70._M_head_impl =
             *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if ((int  [2])local_70._M_head_impl == aiVar20) {
          local_60 = *(ulong *)aiVar20;
          aiStack_58 = paiVar5[3];
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
        }
        else {
          local_60 = *(ulong *)aiVar20;
        }
        local_68 = paiVar5[1];
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)aiVar20 = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_90 = (long *)*puVar7;
        plVar6 = puVar7 + 2;
        if (local_90 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = puVar7[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
        }
        local_88 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
        psVar9 = (stringstream *)(puVar7 + 2);
        if (local_50._M_head_impl == psVar9) {
          local_40._0_8_ = *(undefined8 *)psVar9;
          local_40._8_8_ = *(int (*) [2])(puVar7 + 3);
          local_50._M_head_impl = (stringstream *)local_40;
        }
        else {
          local_40._0_8_ = *(undefined8 *)psVar9;
        }
        local_48 = (int  [2])puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_50);
        local_b0._M_dataplus._M_p = *(pointer *)paiVar5;
        _Var10._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (paiVar5 + 2);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._M_dataplus._M_p != _Var10._M_head_impl) goto LAB_00150318;
        local_b0.field_2._M_allocated_capacity = *(undefined8 *)_Var10._M_head_impl;
        local_b0.field_2._8_8_ = paiVar5[3];
        local_b0._M_dataplus._M_p = (pointer)aiVar19;
      }
      else {
        do {
          iVar1 = close(local_114);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_118;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"CHECK failed: File ","");
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_f0);
        pipe_fd = *paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if (pipe_fd == aiVar20) {
          local_100 = *(long *)aiVar20;
          aiStack_f8 = paiVar5[3];
          pipe_fd = (int  [2])&local_100;
        }
        else {
          local_100 = *(long *)aiVar20;
        }
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)paiVar5[2] = 0;
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
        local_d0 = *paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if (local_d0 == aiVar20) {
          local_c0 = *(ulong *)aiVar20;
          aiStack_b8 = paiVar5[3];
          local_d0 = (int  [2])&local_c0;
        }
        else {
          local_c0 = *(ulong *)aiVar20;
        }
        local_c8 = paiVar5[1];
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)paiVar5[2] = 0;
        local_13c = 0x485;
        StreamableToString<int>(&local_138,&local_13c);
        uVar15 = 0xf;
        if (local_d0 != (int  [2])&local_c0) {
          uVar15 = local_c0;
        }
        if (uVar15 < local_138._M_string_length + (long)local_c8) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_138._M_dataplus._M_p._4_4_,local_138._M_dataplus._M_p._0_4_) !=
              &local_138.field_2) {
            uVar16 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_138._M_string_length + (long)local_c8) goto LAB_0014fce5;
          paiVar5 = (int (*) [2])
                    std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_d0);
        }
        else {
LAB_0014fce5:
          paiVar5 = (int (*) [2])
                    std::__cxx11::string::_M_append
                              ((char *)local_d0,
                               (ulong)CONCAT44(local_138._M_dataplus._M_p._4_4_,
                                               local_138._M_dataplus._M_p._0_4_));
        }
        local_70._M_head_impl =
             *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
        aiVar20 = (int  [2])(paiVar5 + 2);
        if ((int  [2])local_70._M_head_impl == aiVar20) {
          local_60 = *(ulong *)aiVar20;
          aiStack_58 = paiVar5[3];
          local_70._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
        }
        else {
          local_60 = *(ulong *)aiVar20;
        }
        local_68 = paiVar5[1];
        *paiVar5 = aiVar20;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)aiVar20 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_90 = (long *)*plVar6;
        plVar8 = plVar6 + 2;
        if (local_90 == plVar8) {
          local_80 = *plVar8;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar8;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        local_50._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar7;
        psVar9 = (stringstream *)(puVar7 + 2);
        if (local_50._M_head_impl == psVar9) {
          local_40._0_8_ = *(undefined8 *)psVar9;
          local_40._8_8_ = *(int (*) [2])(puVar7 + 3);
          local_50._M_head_impl = (stringstream *)local_40;
        }
        else {
          local_40._0_8_ = *(undefined8 *)psVar9;
        }
        local_48 = (int  [2])puVar7[1];
        *puVar7 = psVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_50);
        local_b0._M_dataplus._M_p = *(pointer *)paiVar5;
        _Var10._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (paiVar5 + 2);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_b0._M_dataplus._M_p == _Var10._M_head_impl) {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)_Var10._M_head_impl;
          local_b0.field_2._8_8_ = paiVar5[3];
          local_b0._M_dataplus._M_p = (pointer)aiVar19;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *(undefined8 *)_Var10._M_head_impl;
        }
        local_b0._M_string_length = *(size_type *)(paiVar5 + 1);
        *paiVar5 = (int  [2])_Var10._M_head_impl;
        paiVar5[1] = (int  [2])0x0;
        *(undefined1 *)paiVar5[2] = 0;
        DeathTestAbort(&local_b0);
        paiVar5 = extraout_RAX;
        local_b0._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_00150318:
        local_b0.field_2._M_allocated_capacity = *(undefined8 *)_Var10._M_head_impl;
      }
      aiVar20 = (int  [2])&local_f0.field_2;
      aiVar17 = (int  [2])&local_100;
      local_b0._M_string_length = *(size_type *)(paiVar5 + 1);
      *paiVar5 = (int  [2])_Var10._M_head_impl;
      paiVar5[1] = (int  [2])0x0;
      *(undefined1 *)paiVar5[2] = 0;
      DeathTestAbort(&local_b0);
LAB_0015034c:
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)_Var10._M_head_impl);
      goto LAB_0015035c;
    }
    aiVar20 = (int  [2])&local_100;
    pipe_fd = aiVar20;
    std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"CHECK failed: File ","");
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)pipe_fd);
    aiVar17 = (int  [2])&local_c0;
    local_d0 = *paiVar5;
    aiVar18 = (int  [2])(paiVar5 + 2);
    if (local_d0 == aiVar18) {
      local_c0 = *(ulong *)aiVar18;
      aiStack_b8 = paiVar5[3];
      local_d0 = aiVar17;
    }
    else {
      local_c0 = *(ulong *)aiVar18;
    }
    local_c8 = paiVar5[1];
    *paiVar5 = aiVar18;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)local_d0);
    aiVar18 = (int  [2])&local_60;
    local_70._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
    aiVar11 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_70._M_head_impl == aiVar11) {
      local_60 = *(ulong *)aiVar11;
      aiStack_58 = paiVar5[3];
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)aiVar18;
    }
    else {
      local_60 = *(ulong *)aiVar11;
    }
    local_68 = paiVar5[1];
    *paiVar5 = aiVar11;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    local_138._M_dataplus._M_p._0_4_ = 0x476;
    StreamableToString<int>(&local_f0,(int *)&local_138);
    uVar15 = 0xf;
    if ((int  [2])local_70._M_head_impl != aiVar18) {
      uVar15 = local_60;
    }
    if (uVar15 < local_f0._M_string_length + (long)local_68) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar16 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_f0._M_string_length + (long)local_68) goto LAB_00150285;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)local_70._M_head_impl);
    }
    else {
LAB_00150285:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
    }
    local_90 = (long *)*puVar7;
    plVar6 = puVar7 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = puVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_90);
    local_50._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)paiVar5;
    aiVar11 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_50._M_head_impl == aiVar11) {
      local_40._0_8_ = *(undefined8 *)aiVar11;
      local_40._8_8_ = paiVar5[3];
      local_50._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
    }
    else {
      local_40._0_8_ = *(undefined8 *)aiVar11;
    }
    local_48 = paiVar5[1];
    *paiVar5 = aiVar11;
    paiVar5[1] = (int  [2])0x0;
    *(undefined1 *)paiVar5[2] = 0;
    paiVar5 = (int (*) [2])std::__cxx11::string::append((char *)&local_50);
    local_b0._M_dataplus._M_p = *(pointer *)paiVar5;
    aiVar11 = (int  [2])(paiVar5 + 2);
    if ((int  [2])local_b0._M_dataplus._M_p == aiVar11) {
      local_b0.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
      local_b0.field_2._8_8_ = paiVar5[3];
      local_b0._M_dataplus._M_p = (pointer)aiVar19;
      goto LAB_0015055a;
    }
  }
  local_b0.field_2._M_allocated_capacity = *(undefined8 *)aiVar11;
LAB_0015055a:
  local_b0._M_string_length = *(size_type *)(paiVar5 + 1);
  *paiVar5 = aiVar11;
  paiVar5[1] = (int  [2])0x0;
  *(undefined1 *)paiVar5[2] = 0;
  DeathTestAbort(&local_b0);
  if ((int  [2])local_b0._M_dataplus._M_p != aiVar19) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40) {
    operator_delete(local_50._M_head_impl,local_40._0_8_ + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((int  [2])local_70._M_head_impl != aiVar18) {
    operator_delete(local_70._M_head_impl,local_60 + 1);
  }
  if (local_d0 != aiVar17) {
    operator_delete((void *)local_d0,local_c0 + 1);
  }
  if (pipe_fd != aiVar20) {
    operator_delete((void *)pipe_fd,local_100 + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}